

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_get_ddos_config_options.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52ea8::Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>::
Json2Array(Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType> *this,
          Value *value,
          vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>_>
          *vec)

{
  uint uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_38 [8];
  YundunGetDdosConfigOptionsRequestThresholdOptionType val;
  int i;
  vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.pps._4_4_ = 0; uVar1 = val.pps._4_4_, AVar3 = Json::Value::size(value), uVar1 < AVar3;
        val.pps._4_4_ = val.pps._4_4_ + 1) {
      value_00 = Json::Value::operator[](value,val.pps._4_4_);
      anon_unknown.dwarf_52ea8::Json2Type
                (value_00,(YundunGetDdosConfigOptionsRequestThresholdOptionType *)local_38);
      std::
      vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>_>
      ::push_back(vec,(value_type *)local_38);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }